

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.cpp
# Opt level: O0

tdefl_status
duckdb_miniz::tdefl_compress
          (tdefl_compressor *d,void *pIn_buf,size_t *pIn_buf_size,void *pOut_buf,
          size_t *pOut_buf_size,tdefl_flush flush)

{
  mz_bool mVar1;
  int iVar2;
  mz_ulong mVar3;
  long in_RCX;
  long *in_RDX;
  uchar *in_RSI;
  long *in_RDI;
  tdefl_compressor *in_R8;
  int in_R9D;
  int in_stack_00000084;
  tdefl_compressor *in_stack_00000088;
  tdefl_compressor *in_stack_00000090;
  bool local_41;
  long local_40;
  tdefl_status local_4;
  
  if (in_RDI == (long *)0x0) {
    if (in_RDX != (long *)0x0) {
      *in_RDX = 0;
    }
    if (in_R8 != (tdefl_compressor *)0x0) {
      in_R8->m_pPut_buf_func = (tdefl_put_buf_func_ptr)0x0;
    }
    local_4 = TDEFL_STATUS_BAD_PARAM;
  }
  else {
    in_RDI[0x11] = (long)in_RSI;
    in_RDI[0x13] = (long)in_RDX;
    in_RDI[0x12] = in_RCX;
    in_RDI[0x14] = (long)in_R8;
    in_RDI[0x16] = (long)in_RSI;
    if (in_RDX == (long *)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = *in_RDX;
    }
    in_RDI[0x17] = local_40;
    in_RDI[0x18] = 0;
    *(int *)(in_RDI + 0x15) = in_R9D;
    local_41 = in_RCX != 0 || in_R8 != (tdefl_compressor *)0x0;
    if (((((*in_RDI != 0) == local_41) || (*(int *)((long)in_RDI + 0x84) != 0)) ||
        (((int)in_RDI[0x10] != 0 && (in_R9D != 4)))) ||
       ((((in_RDX != (long *)0x0 && (*in_RDX != 0)) && (in_RSI == (uchar *)0x0)) ||
        (((in_R8 != (tdefl_compressor *)0x0 &&
          (in_R8->m_pPut_buf_func != (tdefl_put_buf_func_ptr)0x0)) && (in_RCX == 0)))))) {
      if (in_RDX != (long *)0x0) {
        *in_RDX = 0;
      }
      if (in_R8 != (tdefl_compressor *)0x0) {
        in_R8->m_pPut_buf_func = (tdefl_put_buf_func_ptr)0x0;
      }
      *(undefined4 *)((long)in_RDI + 0x84) = 0xfffffffe;
      local_4 = TDEFL_STATUS_BAD_PARAM;
    }
    else {
      *(uint *)(in_RDI + 0x10) = (uint)(in_R9D == 4) | *(uint *)(in_RDI + 0x10);
      if ((*(int *)((long)in_RDI + 0x74) == 0) && ((int)in_RDI[0xf] == 0)) {
        mVar1 = tdefl_compress_normal(in_stack_00000090);
        if (mVar1 == 0) {
          local_4 = *(tdefl_status *)((long)in_RDI + 0x84);
        }
        else {
          if (((*(uint *)(in_RDI + 2) & 0x3000) != 0) && (in_RSI != (uchar *)0x0)) {
            mVar3 = mz_adler32((ulong)*(uint *)(in_RDI + 4),in_RSI,in_RDI[0x16] - (long)in_RSI);
            *(int *)(in_RDI + 4) = (int)mVar3;
          }
          if ((((in_R9D != 0) && ((int)in_RDI[5] == 0)) && (in_RDI[0x17] == 0)) &&
             (*(int *)((long)in_RDI + 0x74) == 0)) {
            iVar2 = tdefl_flush_block(in_stack_00000088,in_stack_00000084);
            if (iVar2 < 0) {
              return *(tdefl_status *)((long)in_RDI + 0x84);
            }
            *(uint *)(in_RDI + 0xf) = (uint)(in_R9D == 4);
            if (in_R9D == 3) {
              memset((void *)((long)in_RDI + 0x292aa),0,0x10000);
              memset((void *)((long)in_RDI + 0x192aa),0,0x10000);
              *(undefined4 *)((long)in_RDI + 0x2c) = 0;
            }
          }
          local_4 = tdefl_flush_output_buffer(in_R8);
          *(tdefl_status *)((long)in_RDI + 0x84) = local_4;
        }
      }
      else {
        local_4 = tdefl_flush_output_buffer(in_R8);
        *(tdefl_status *)((long)in_RDI + 0x84) = local_4;
      }
    }
  }
  return local_4;
}

Assistant:

tdefl_status tdefl_compress(tdefl_compressor *d, const void *pIn_buf, size_t *pIn_buf_size, void *pOut_buf, size_t *pOut_buf_size, tdefl_flush flush)
{
    if (!d)
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return TDEFL_STATUS_BAD_PARAM;
    }

    d->m_pIn_buf = pIn_buf;
    d->m_pIn_buf_size = pIn_buf_size;
    d->m_pOut_buf = pOut_buf;
    d->m_pOut_buf_size = pOut_buf_size;
    d->m_pSrc = (const mz_uint8 *)(pIn_buf);
    d->m_src_buf_left = pIn_buf_size ? *pIn_buf_size : 0;
    d->m_out_buf_ofs = 0;
    d->m_flush = flush;

    if (((d->m_pPut_buf_func != NULL) == ((pOut_buf != NULL) || (pOut_buf_size != NULL))) || (d->m_prev_return_status != TDEFL_STATUS_OKAY) ||
        (d->m_wants_to_finish && (flush != TDEFL_FINISH)) || (pIn_buf_size && *pIn_buf_size && !pIn_buf) || (pOut_buf_size && *pOut_buf_size && !pOut_buf))
    {
        if (pIn_buf_size)
            *pIn_buf_size = 0;
        if (pOut_buf_size)
            *pOut_buf_size = 0;
        return (d->m_prev_return_status = TDEFL_STATUS_BAD_PARAM);
    }
    d->m_wants_to_finish |= (flush == TDEFL_FINISH);

    if ((d->m_output_flush_remaining) || (d->m_finished))
        return (d->m_prev_return_status = tdefl_flush_output_buffer(d));

#if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN
    if (((d->m_flags & TDEFL_MAX_PROBES_MASK) == 1) &&
        ((d->m_flags & TDEFL_GREEDY_PARSING_FLAG) != 0) &&
        ((d->m_flags & (TDEFL_FILTER_MATCHES | TDEFL_FORCE_ALL_RAW_BLOCKS | TDEFL_RLE_MATCHES)) == 0))
    {
        if (!tdefl_compress_fast(d))
            return d->m_prev_return_status;
    }
    else
#endif /* #if MINIZ_USE_UNALIGNED_LOADS_AND_STORES && MINIZ_LITTLE_ENDIAN */
    {
        if (!tdefl_compress_normal(d))
            return d->m_prev_return_status;
    }

    if ((d->m_flags & (TDEFL_WRITE_ZLIB_HEADER | TDEFL_COMPUTE_ADLER32)) && (pIn_buf))
        d->m_adler32 = (mz_uint32)mz_adler32(d->m_adler32, (const mz_uint8 *)pIn_buf, d->m_pSrc - (const mz_uint8 *)pIn_buf);

    if ((flush) && (!d->m_lookahead_size) && (!d->m_src_buf_left) && (!d->m_output_flush_remaining))
    {
        if (tdefl_flush_block(d, flush) < 0)
            return d->m_prev_return_status;
        d->m_finished = (flush == TDEFL_FINISH);
        if (flush == TDEFL_FULL_FLUSH)
        {
            MZ_CLEAR_OBJ(d->m_hash);
            MZ_CLEAR_OBJ(d->m_next);
            d->m_dict_size = 0;
        }
    }

    return (d->m_prev_return_status = tdefl_flush_output_buffer(d));
}